

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_Nodes.hpp
# Opt level: O2

int __thiscall
Indexing::SubstitutionTree<Indexing::LiteralClause>::UArrIntermediateNode::remove
          (UArrIntermediateNode *this,char *__filename)

{
  int iVar1;
  long lVar2;
  bool bVar3;
  int i;
  long lVar4;
  Top TVar5;
  Coproduct<Kernel::VarNumber,_Kernel::SymbolId> local_40;
  char *local_30 [2];
  
  lVar2 = 0;
  local_30[0] = __filename;
  do {
    lVar4 = lVar2;
    iVar1 = *(int *)&(this->super_IntermediateNode).field_0x14;
    if (iVar1 <= lVar4) {
      return iVar1;
    }
    TVar5 = Kernel::TermList::top(&this->_nodes[lVar4]->_term);
    local_40._inner._0_8_ = TVar5._inner._inner._0_8_;
    local_40._inner._content[7] = TVar5._inner._inner._content[7];
    bVar3 = Lib::operator==((Coproduct<Kernel::VarNumber,_Kernel::SymbolId> *)local_30,&local_40);
    lVar2 = lVar4 + 1;
  } while (!bVar3);
  iVar1 = *(int *)&(this->super_IntermediateNode).field_0x14;
  *(int *)&(this->super_IntermediateNode).field_0x14 = iVar1 + -1;
  this->_nodes[lVar4] = this->_nodes[(long)iVar1 + -1];
  this->_nodes[(long)iVar1 + -1] = (Node *)0x0;
  return iVar1;
}

Assistant:

void SubstitutionTree<LeafData_>::UArrIntermediateNode::remove(TermList::Top t)
{
  for(int i=0;i<_size;i++) {
    if(t == _nodes[i]->top()) {
      _size--;
      _nodes[i]=_nodes[_size];
      _nodes[_size]=0;
      return;
    }
  }
  ASSERTION_VIOLATION;
}